

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O0

ssize_t recvfrom(int __fd,void *__buf,size_t __n,int __flags,sockaddr *__addr,socklen_t *__addr_len)

{
  bool bVar1;
  int *piVar2;
  ssize_t ret;
  undefined2 local_50;
  pollfd pf;
  int timeout;
  rpchook_t *lp;
  socklen_t *address_len_local;
  sockaddr *address_local;
  int flags_local;
  size_t length_local;
  void *buffer_local;
  ssize_t sStack_10;
  int socket_local;
  
  if (g_sys_recvfrom_func == (recvfrom_pfn_t)0x0) {
    g_sys_recvfrom_func = (recvfrom_pfn_t)dlsym(0xffffffffffffffff);
  }
  bVar1 = co_is_enable_sys_hook();
  if (bVar1) {
    register0x00000000 = get_by_fd(__fd);
    if ((register0x00000000 == (rpchook_t *)0x0) || ((register0x00000000->user_flag & 0x800U) != 0))
    {
      sStack_10 = (*g_sys_recvfrom_func)(__fd,__buf,__n,__flags,(sockaddr *)__addr,__addr_len);
    }
    else {
      pf.fd = (int)(register0x00000000->read_timeout).tv_sec * 1000 +
              (int)((register0x00000000->read_timeout).tv_usec / 1000);
      memset((void *)((long)&ret + 4),0,8);
      local_50 = 0x19;
      ret._4_4_ = __fd;
      poll((pollfd *)((long)&ret + 4),1,pf.fd);
      sStack_10 = (*g_sys_recvfrom_func)(__fd,__buf,__n,__flags,(sockaddr *)__addr,__addr_len);
      if ((sStack_10 < 0) && (piVar2 = __errno_location(), *piVar2 == 0xb)) {
        piVar2 = __errno_location();
        *piVar2 = 0x7c5;
      }
    }
  }
  else {
    sStack_10 = (*g_sys_recvfrom_func)(__fd,__buf,__n,__flags,(sockaddr *)__addr,__addr_len);
  }
  return sStack_10;
}

Assistant:

ssize_t recvfrom(int socket, void *buffer, size_t length,
	                 int flags, struct sockaddr *address,
					               socklen_t *address_len)
{
	HOOK_SYS_FUNC( recvfrom );
	if( !co_is_enable_sys_hook() )
	{
		return g_sys_recvfrom_func( socket,buffer,length,flags,address,address_len );
	}

	rpchook_t *lp = get_by_fd( socket );
	if( !lp || ( O_NONBLOCK & lp->user_flag ) )
	{
		return g_sys_recvfrom_func( socket,buffer,length,flags,address,address_len );
	}

	int timeout = ( lp->read_timeout.tv_sec * 1000 ) 
				+ ( lp->read_timeout.tv_usec / 1000 );


	struct pollfd pf = { 0 };
	pf.fd = socket;
	pf.events = ( POLLIN | POLLERR | POLLHUP );
	poll( &pf,1,timeout );

	ssize_t ret = g_sys_recvfrom_func( socket,buffer,length,flags,address,address_len );
	if(ret<0 && errno == EAGAIN){
		//timeout from co_routine_poll, errno set to indicate special value
		errno = LIBCO_POLL_TIMEOUT;
	}
	return ret;
}